

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

qsizetype QtPrivate::indexOf<QUrl,QUrl>(QList<QUrl> *vector,QUrl *u,qsizetype from)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  QUrl *pQVar6;
  qsizetype qVar7;
  
  if (from < 0) {
    from = from + (vector->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  uVar1 = (vector->d).size;
  if ((ulong)from < uVar1) {
    pQVar6 = (vector->d).ptr + from;
    lVar2 = uVar1 * 8 + from * -8;
    lVar3 = 8 - (long)pQVar6;
    do {
      qVar7 = lVar3;
      lVar5 = lVar2;
      if (lVar5 == 0) goto LAB_0050179e;
      cVar4 = comparesEqual(pQVar6,u);
      pQVar6 = pQVar6 + 1;
      lVar2 = lVar5 + -8;
      lVar3 = qVar7 + -8;
    } while (cVar4 == '\0');
    qVar7 = -((long)&(vector->d).ptr[-1].d + qVar7) >> 3;
LAB_0050179e:
    if (lVar5 != 0) {
      return qVar7;
    }
  }
  return -1;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}